

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::GetExtraSources
          (cmGeneratorTarget *this,
          vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *data,string *config)

{
  bool bVar1;
  reference ppcVar2;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_168;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_160;
  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_158;
  const_iterator si;
  TagVisitor<ExtraSourcesTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  visitor;
  undefined1 local_38 [8];
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sourceFiles;
  string *config_local;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *data_local;
  cmGeneratorTarget *this_local;
  
  sourceFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)config;
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
            ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_38);
  GetSourceFiles(this,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_38,
                 (string *)
                 sourceFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage);
  TagVisitor<ExtraSourcesTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  ::TagVisitor((TagVisitor<ExtraSourcesTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                *)&si,this,data);
  local_160._M_current =
       (cmSourceFile **)
       std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                 ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_38);
  __gnu_cxx::
  __normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>::
  __normal_iterator<cmSourceFile**>
            ((__normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
              *)&local_158,&local_160);
  while( true ) {
    local_168._M_current =
         (cmSourceFile **)
         std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                   ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_38);
    bVar1 = __gnu_cxx::operator!=(&local_158,&local_168);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
              ::operator*(&local_158);
    TagVisitor<ExtraSourcesTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
    ::Accept((TagVisitor<ExtraSourcesTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
              *)&si,*ppcVar2);
    __gnu_cxx::
    __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
    ::operator++(&local_158);
  }
  TagVisitor<ExtraSourcesTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  ::~TagVisitor((TagVisitor<ExtraSourcesTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                 *)&si);
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
            ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_38);
  return;
}

Assistant:

void cmGeneratorTarget
::GetExtraSources(std::vector<cmSourceFile const*>& data,
                  const std::string& config) const
{
  IMPLEMENT_VISIT(ExtraSources);
}